

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool bssl::anon_unknown_0::GetECHLength
               (SSL_CTX *ctx,size_t *out_client_hello_len,size_t *out_ech_len,size_t max_name_len,
               char *name)

{
  bool bVar1;
  int iVar2;
  EVP_HPKE_KEM *kem;
  Span<unsigned_char> SVar3;
  UniquePtr<SSL> ssl;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<uint8_t> free_ech_config;
  uint8_t *ech_config;
  vector<unsigned_char,_std::allocator<unsigned_char>_> client_hello;
  size_t ech_config_len;
  uint8_t *unused;
  Span<unsigned_char> local_120;
  ScopedEVP_HPKE_KEY key;
  SSL_CLIENT_HELLO parsed;
  
  EVP_HPKE_KEY_zero(&key.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_generate(&key.ctx_,kem);
  if (iVar2 != 0) {
    iVar2 = SSL_marshal_ech_config
                      (&ech_config,&ech_config_len,'\x01',&key.ctx_,"public.example",0x80);
    if (iVar2 != 0) {
      free_ech_config._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)ech_config;
      keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)SSL_ECH_KEYS_new()
      ;
      if ((tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
          keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0) {
LAB_0015ed6f:
        bVar1 = false;
      }
      else {
        iVar2 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                 keys._M_t.
                                 super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                                 ech_config,ech_config_len,&key.ctx_);
        if (iVar2 == 0) goto LAB_0015ed6f;
        ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)SSL_new((SSL_CTX *)ctx);
        if ((tuple<ssl_st_*,_bssl::internal::Deleter>)
            ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_ssl_st_*,_false>)0x0) {
LAB_0015ed73:
          bVar1 = false;
        }
        else {
          bVar1 = InstallECHConfigList
                            ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                    _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                             (SSL_ECH_KEYS *)
                             keys._M_t.
                             super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl);
          if (!bVar1) goto LAB_0015ed73;
          if (max_name_len != 0) {
            iVar2 = SSL_set_tlsext_host_name
                              ((SSL *)ssl._M_t.
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                               (char *)max_name_len);
            if (iVar2 == 0) goto LAB_0015ed73;
          }
          SSL_set_connect_state
                    ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar1 = GetClientHello((SSL *)ssl._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                 &client_hello);
          if (bVar1) {
            local_120.data_ =
                 client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_120.size_ =
                 (long)client_hello.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)client_hello.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            SVar3 = Span<unsigned_char>::subspan(&local_120,9,0xffffffffffffffff);
            iVar2 = SSL_parse_client_hello
                              ((SSL *)ssl._M_t.
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&parsed,
                               SVar3.data_,SVar3.size_);
            if (iVar2 == 0) goto LAB_0015ed77;
            iVar2 = SSL_early_callback_ctx_extension_get(&parsed,0xfe0d,&unused,out_ech_len);
            if (iVar2 == 0) goto LAB_0015ed77;
            *out_client_hello_len =
                 (long)client_hello.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)client_hello.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            bVar1 = true;
          }
          else {
LAB_0015ed77:
            bVar1 = false;
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    );
        }
        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&ssl);
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_ech_config);
      goto LAB_0015ed9f;
    }
  }
  bVar1 = false;
LAB_0015ed9f:
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key);
  return bVar1;
}

Assistant:

static bool GetECHLength(SSL_CTX *ctx, size_t *out_client_hello_len,
                         size_t *out_ech_len, size_t max_name_len,
                         const char *name) {
  bssl::ScopedEVP_HPKE_KEY key;
  uint8_t *ech_config;
  size_t ech_config_len;
  if (!EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()) ||
      !SSL_marshal_ech_config(&ech_config, &ech_config_len,
                              /*config_id=*/1, key.get(), "public.example",
                              max_name_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  if (!keys || !SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                                 ech_config_len, key.get())) {
    return false;
  }

  bssl::UniquePtr<SSL> ssl(SSL_new(ctx));
  if (!ssl || !InstallECHConfigList(ssl.get(), keys.get()) ||
      (name != nullptr && !SSL_set_tlsext_host_name(ssl.get(), name))) {
    return false;
  }
  SSL_set_connect_state(ssl.get());

  std::vector<uint8_t> client_hello;
  SSL_CLIENT_HELLO parsed;
  const uint8_t *unused;
  if (!GetClientHello(ssl.get(), &client_hello)) {
    return false;
  }
  // Skip record and handshake headers. This assumes the ClientHello
  // fits in one record.
  auto body =
      Span(client_hello).subspan(SSL3_RT_HEADER_LENGTH + SSL3_HM_HEADER_LENGTH);
  if (!SSL_parse_client_hello(ssl.get(), &parsed, body.data(), body.size()) ||
      !SSL_early_callback_ctx_extension_get(
          &parsed, TLSEXT_TYPE_encrypted_client_hello, &unused, out_ech_len)) {
    return false;
  }
  *out_client_hello_len = client_hello.size();
  return true;
}